

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O0

void ffswap8_slow(double *dvalues,long nvals)

{
  undefined1 uVar1;
  char temp;
  char *cvalues;
  long ii;
  long nvals_local;
  double *dvalues_local;
  
  for (ii = 0; ii < nvals * 8; ii = ii + 8) {
    uVar1 = *(undefined1 *)((long)dvalues + ii);
    *(undefined1 *)((long)dvalues + ii) = *(undefined1 *)((long)dvalues + ii + 7);
    *(undefined1 *)((long)dvalues + ii + 7) = uVar1;
    uVar1 = *(undefined1 *)((long)dvalues + ii + 1);
    *(undefined1 *)((long)dvalues + ii + 1) = *(undefined1 *)((long)dvalues + ii + 6);
    *(undefined1 *)((long)dvalues + ii + 6) = uVar1;
    uVar1 = *(undefined1 *)((long)dvalues + ii + 2);
    *(undefined1 *)((long)dvalues + ii + 2) = *(undefined1 *)((long)dvalues + ii + 5);
    *(undefined1 *)((long)dvalues + ii + 5) = uVar1;
    uVar1 = *(undefined1 *)((long)dvalues + ii + 3);
    *(undefined1 *)((long)dvalues + ii + 3) = *(undefined1 *)((long)dvalues + ii + 4);
    *(undefined1 *)((long)dvalues + ii + 4) = uVar1;
  }
  return;
}

Assistant:

static void ffswap8_slow(double *dvalues, long nvals)
{
    register long ii;
#ifdef HAVE_BSWAP
    LONGLONG * llvalues = (LONGLONG*)dvalues;

    for (ii = 0; ii < nvals; ii++) {
        llvalues[ii] = __builtin_bswap64(llvalues[ii]);
    }
#elif defined(_MSC_VER) && (_MSC_VER >= 1400)
    /* intrinsic byte swapping function in Microsoft Visual C++ 8.0 and later */
    unsigned __int64 * llvalues = (unsigned __int64 *) dvalues;

    for (ii = 0; ii < nvals; ii++)
    {
        llvalues[ii] = _byteswap_uint64(llvalues[ii]);
    }
#else
    register char *cvalues;
    register char temp;

    cvalues = (char *) dvalues;      /* copy the pointer value */

    for (ii = 0; ii < nvals*8; ii += 8)
    {
        temp = cvalues[ii];
        cvalues[ii] = cvalues[ii+7];
        cvalues[ii+7] = temp;

        temp = cvalues[ii+1];
        cvalues[ii+1] = cvalues[ii+6];
        cvalues[ii+6] = temp;

        temp = cvalues[ii+2];
        cvalues[ii+2] = cvalues[ii+5];
        cvalues[ii+5] = temp;

        temp = cvalues[ii+3];
        cvalues[ii+3] = cvalues[ii+4];
        cvalues[ii+4] = temp;
    }
#endif
}